

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

fid __thiscall ezexample::hash(ezexample *this,string *fstr)

{
  uint64_t uVar1;
  string *in_RSI;
  uint64_t in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  vw *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,in_RSI);
  uVar1 = VW::hash_feature(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                           in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return (fid)uVar1;
}

Assistant:

inline fid hash(std::string fstr) { return VW::hash_feature(*vw_ref, fstr, current_seed); }